

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O1

bool IsSegmentApproximationClose(double tmin,double tmax,Coeff2 coeff,SegmentQ s,double error)

{
  double dVar1;
  double dVar2;
  Point p;
  double dVar3;
  
  dVar2 = (tmax - tmin) * 0.25;
  dVar1 = tmin + dVar2;
  while ((dVar1 < tmax + -1e-06 &&
         (p.x = ((dVar1 * coeff._M_elems[3].x + coeff._M_elems[2].x) * dVar1 + coeff._M_elems[1].x)
                * dVar1 + coeff._M_elems[0].x,
         p.y = ((dVar1 * coeff._M_elems[3].y + coeff._M_elems[2].y) * dVar1 + coeff._M_elems[1].y) *
               dVar1 + coeff._M_elems[0].y, dVar3 = MinDistanceToQuad(p,s), dVar3 <= error))) {
    dVar1 = dVar1 + dVar2;
  }
  return tmax + -1e-06 <= dVar1;
}

Assistant:

bool IsSegmentApproximationClose(double tmin, double tmax, Coeff2 coeff,
                                 SegmentQ s, double error)
{
	int n = 4;
	double dt = (tmax - tmin) / n;
	for (double t = tmin + dt; t < tmax - 1e-6; t += dt)
	{
		Point p = CalcPoint(t, coeff);
		if (MinDistanceToQuad(p, s) > error)
			return false;
	}
	return true;
}